

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O3

void __thiscall
leveldb::log::Reader::Reader
          (Reader *this,SequentialFile *file,Reporter *reporter,bool checksum,
          uint64_t initial_offset)

{
  char *pcVar1;
  
  this->file_ = file;
  this->reporter_ = reporter;
  this->checksum_ = checksum;
  pcVar1 = (char *)operator_new__(0x8000);
  this->backing_store_ = pcVar1;
  (this->buffer_).data_ = "";
  (this->buffer_).size_ = 0;
  this->eof_ = false;
  this->last_record_offset_ = 0;
  this->end_of_buffer_offset_ = 0;
  this->initial_offset_ = initial_offset;
  this->resyncing_ = initial_offset != 0;
  return;
}

Assistant:

Reader::Reader(SequentialFile* file, Reporter* reporter, bool checksum,
               uint64_t initial_offset)
    : file_(file),
      reporter_(reporter),
      checksum_(checksum),
      backing_store_(new char[kBlockSize]),
      buffer_(),
      eof_(false),
      last_record_offset_(0),
      end_of_buffer_offset_(0),
      initial_offset_(initial_offset),
      resyncing_(initial_offset > 0) {}